

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImFontAtlas::GetTexDataAsRGBA32
          (ImFontAtlas *this,uchar **out_pixels,int *out_width,int *out_height,
          int *out_bytes_per_pixel)

{
  uint *puVar1;
  int iVar2;
  long lVar3;
  uchar *pixels;
  uchar *local_30;
  
  if (this->TexPixelsRGBA32 == (uint *)0x0) {
    GetTexDataAsAlpha8(this,&local_30,(int *)0x0,(int *)0x0,(int *)0x0);
    puVar1 = (uint *)ImGui::MemAlloc((long)(this->TexWidth * this->TexHeight * 4));
    this->TexPixelsRGBA32 = puVar1;
    iVar2 = this->TexHeight * this->TexWidth;
    if (0 < iVar2) {
      iVar2 = iVar2 + 1;
      lVar3 = 0;
      do {
        puVar1[lVar3] = (uint)local_30[lVar3] << 0x18 | 0xffffff;
        iVar2 = iVar2 + -1;
        lVar3 = lVar3 + 1;
      } while (1 < iVar2);
    }
  }
  *out_pixels = (uchar *)this->TexPixelsRGBA32;
  if (out_width != (int *)0x0) {
    *out_width = this->TexWidth;
  }
  if (out_height != (int *)0x0) {
    *out_height = this->TexHeight;
  }
  if (out_bytes_per_pixel != (int *)0x0) {
    *out_bytes_per_pixel = 4;
  }
  return;
}

Assistant:

void    ImFontAtlas::GetTexDataAsRGBA32(unsigned char** out_pixels, int* out_width, int* out_height, int* out_bytes_per_pixel)
{
    // Convert to RGBA32 format on demand
    // Although it is likely to be the most commonly used format, our font rendering is 1 channel / 8 bpp
    if (!TexPixelsRGBA32)
    {
        unsigned char* pixels;
        GetTexDataAsAlpha8(&pixels, NULL, NULL);
        TexPixelsRGBA32 = (unsigned int*)ImGui::MemAlloc((size_t)(TexWidth * TexHeight * 4));
        const unsigned char* src = pixels;
        unsigned int* dst = TexPixelsRGBA32;
        for (int n = TexWidth * TexHeight; n > 0; n--)
            *dst++ = ((unsigned int)(*src++) << 24) | 0x00FFFFFF;
    }

    *out_pixels = (unsigned char*)TexPixelsRGBA32;
    if (out_width) *out_width = TexWidth;
    if (out_height) *out_height = TexHeight;
    if (out_bytes_per_pixel) *out_bytes_per_pixel = 4;
}